

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<double>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>::
operator()(ShadedRenderer<ImPlot::GetterYs<double>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
           *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  int iVar6;
  uint uVar7;
  GetterYs<double> *pGVar8;
  TransformerLogLog *pTVar9;
  ImPlotPlot *pIVar10;
  GetterYRef *pGVar11;
  ImDrawVert *pIVar12;
  uint *puVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ImPlotContext *pIVar17;
  ImPlotContext *pIVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  double dVar24;
  float fVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar34;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar35;
  float fVar36;
  
  pIVar17 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  dVar24 = (double)(prim + 1);
  iVar6 = pGVar8->Count;
  dVar1 = *(double *)
           ((long)pGVar8->Ys +
           (long)(((prim + 1 + pGVar8->Offset) % iVar6 + iVar6) % iVar6) * (long)pGVar8->Stride);
  dVar14 = log10((pGVar8->XScale * dVar24 + pGVar8->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar17->CurrentPlot;
  dVar2 = pIVar17->LogDenX;
  dVar3 = (pIVar10->XAxis).Range.Min;
  dVar4 = (pIVar10->XAxis).Range.Max;
  dVar1 = log10(dVar1 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  pIVar18 = GImPlot;
  iVar6 = pTVar9->YAxis;
  pIVar10 = pIVar17->CurrentPlot;
  pGVar11 = this->Getter2;
  pTVar9 = this->Transformer;
  auVar32._8_8_ = dVar1;
  auVar32._0_8_ = dVar14;
  dVar1 = pGVar11->YRef;
  auVar15._8_4_ = SUB84(pIVar17->LogDenY[iVar6],0);
  auVar15._0_8_ = dVar2;
  auVar15._12_4_ = (int)((ulong)pIVar17->LogDenY[iVar6] >> 0x20);
  auVar33 = divpd(auVar32,auVar15);
  dVar2 = pIVar10->YAxis[iVar6].Range.Min;
  IVar5 = pIVar17->PixelRange[iVar6].Min;
  fVar22 = (float)(pIVar17->Mx *
                   (((double)(float)auVar33._0_8_ * (dVar4 - dVar3) + dVar3) -
                   (pIVar10->XAxis).Range.Min) + (double)IVar5.x);
  fVar27 = (float)(pIVar17->My[iVar6] *
                   (((double)(float)auVar33._8_8_ * (pIVar10->YAxis[iVar6].Range.Max - dVar2) +
                    dVar2) - dVar2) + (double)IVar5.y);
  dVar14 = log10((dVar24 * pGVar11->XScale + pGVar11->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min)
  ;
  pIVar10 = pIVar18->CurrentPlot;
  dVar2 = pIVar18->LogDenX;
  dVar3 = (pIVar10->XAxis).Range.Min;
  dVar4 = (pIVar10->XAxis).Range.Max;
  dVar1 = log10(dVar1 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  iVar6 = pTVar9->YAxis;
  auVar25._8_8_ = dVar1;
  auVar25._0_8_ = dVar14;
  auVar33._8_4_ = SUB84(pIVar18->LogDenY[iVar6],0);
  auVar33._0_8_ = dVar2;
  auVar33._12_4_ = (int)((ulong)pIVar18->LogDenY[iVar6] >> 0x20);
  auVar33 = divpd(auVar25,auVar33);
  pIVar10 = pIVar18->CurrentPlot;
  dVar1 = pIVar10->YAxis[iVar6].Range.Min;
  IVar5 = pIVar18->PixelRange[iVar6].Min;
  fVar20 = (float)(pIVar18->Mx *
                   (((double)(float)auVar33._0_8_ * (dVar4 - dVar3) + dVar3) -
                   (pIVar10->XAxis).Range.Min) + (double)IVar5.x);
  fVar21 = (float)(pIVar18->My[iVar6] *
                   (((double)(float)auVar33._8_8_ * (pIVar10->YAxis[iVar6].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar5.y);
  fVar28 = (this->P12).x;
  fVar29 = (this->P12).y;
  fVar31 = (this->P11).x;
  fVar34 = (this->P11).y;
  fVar23 = fVar27 * fVar31 - fVar22 * fVar34;
  fVar35 = fVar28 * fVar21 - fVar29 * fVar20;
  fVar31 = fVar31 - fVar22;
  fVar28 = fVar28 - fVar20;
  fVar30 = fVar29 - fVar21;
  fVar36 = fVar30 * fVar31 - (fVar34 - fVar27) * fVar28;
  auVar26._0_4_ = fVar23 * fVar28 - fVar35 * fVar31;
  auVar26._4_4_ = fVar23 * fVar30 - fVar35 * (fVar34 - fVar27);
  auVar26._8_4_ = fVar27 * 0.0 - fVar29 * 0.0;
  auVar26._12_4_ = fVar27 * 0.0 - fVar29 * 0.0;
  auVar16._4_4_ = fVar36;
  auVar16._0_4_ = fVar36;
  auVar16._8_4_ = fVar30;
  auVar16._12_4_ = fVar30;
  auVar33 = divps(auVar26,auVar16);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar12 = DrawList->_VtxWritePtr;
  pIVar12->col = this->Col;
  pIVar12[1].pos.x = fVar22;
  pIVar12[1].pos.y = fVar27;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar12 = DrawList->_VtxWritePtr;
  pIVar12[1].col = this->Col;
  pIVar12[2].pos = auVar33._0_8_;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar12 = DrawList->_VtxWritePtr;
  pIVar12[2].col = this->Col;
  pIVar12[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar12 = DrawList->_VtxWritePtr;
  pIVar12[3].col = this->Col;
  IVar5.y = fVar21;
  IVar5.x = fVar20;
  pIVar12[4].pos = IVar5;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar12 = DrawList->_VtxWritePtr;
  pIVar12[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar12 + 5;
  uVar7 = DrawList->_VtxCurrentIdx;
  puVar13 = DrawList->_IdxWritePtr;
  *puVar13 = uVar7;
  uVar19 = -(uint)(fVar29 < fVar34 && fVar27 < fVar21 || fVar21 < fVar27 && fVar34 < fVar29) & 1;
  puVar13[1] = uVar7 + uVar19 + 1;
  puVar13[2] = DrawList->_VtxCurrentIdx + 3;
  puVar13[3] = DrawList->_VtxCurrentIdx + 1;
  puVar13[4] = (uVar19 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar13[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar13 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar22;
  (this->P11).y = fVar27;
  (this->P12).x = fVar20;
  (this->P12).y = fVar21;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }